

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testUint64InBounds_Test::~atoiTest_testUint64InBounds_Test
          (atoiTest_testUint64InBounds_Test *this)

{
  atoiTest_testUint64InBounds_Test *this_local;
  
  ~atoiTest_testUint64InBounds_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testUint64InBounds) {
  // in bounds
  test<uint64_t>(true,  "0");
  test<uint64_t>(true,  "1");
  test<uint64_t>(true,  "10");
  test<uint64_t>(true,  "10000");
  test<uint64_t>(true,  "1234567890");
  test<uint64_t>(true,  "9223372036854775807"); 
  test<uint64_t>(true,  "9223372036854775808"); 
  test<uint64_t>(true,  "1844674407370955161");
  test<uint64_t>(true,  "18446744073709551610");
  test<uint64_t>(true,  "18446744073709551614");
  test<uint64_t>(true,  "18446744073709551615");
}